

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListAppend(sqlite3 *db,SrcList *pList,Token *pTable,Token *pDatabase)

{
  int iVar1;
  SrcList *pList_00;
  char *pcVar2;
  
  if (pList == (SrcList *)0x0) {
    pList_00 = (SrcList *)sqlite3DbMallocRawNN(db,0x78);
    if (pList_00 == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    pList_00->nSrc = 1;
    pList_00->nAlloc = 1;
    *(undefined8 *)&pList_00->a[0].iCursor = 0;
    pList_00->a[0].pOn = (Expr *)0x0;
    pList_00->a[0].pSchema = (Schema *)0x0;
    pList_00->a[0].zDatabase = (char *)0x0;
    pList_00->a[0].zName = (char *)0x0;
    pList_00->a[0].zAlias = (char *)0x0;
    pList_00->a[0].pTab = (Table *)0x0;
    pList_00->a[0].pSelect = (Select *)0x0;
    pList_00->a[0].addrFillSub = 0;
    pList_00->a[0].regReturn = 0;
    pList_00->a[0].regResult = 0;
    pList_00->a[0].fg = (anon_struct_4_7_7ffbf296_for_fg)0x0;
    pList_00->a[0].pUsing = (IdList *)0x0;
    pList_00->a[0].colUsed = 0;
    pList_00->a[0].u1.zIndexedBy = (char *)0x0;
    pList_00->a[0].pIBIndex = (Index *)0x0;
    pList_00->a[0].iCursor = -1;
  }
  else {
    pList_00 = sqlite3SrcListEnlarge(db,pList,1,pList->nSrc);
  }
  if (db->mallocFailed != '\0') {
    sqlite3SrcListDelete(db,pList_00);
    return (SrcList *)0x0;
  }
  iVar1 = pList_00->nSrc;
  if ((pDatabase != (Token *)0x0) && (pDatabase->z != (char *)0x0)) {
    pcVar2 = sqlite3NameFromToken(db,pDatabase);
    pList_00->a[(long)iVar1 + -1].zName = pcVar2;
    pcVar2 = sqlite3NameFromToken(db,pTable);
    pList_00->a[(long)iVar1 + -1].zDatabase = pcVar2;
    return pList_00;
  }
  pcVar2 = sqlite3NameFromToken(db,pTable);
  pList_00->a[(long)iVar1 + -1].zName = pcVar2;
  pList_00->a[(long)iVar1 + -1].zDatabase = (char *)0x0;
  return pList_00;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppend(
  sqlite3 *db,        /* Connection to notify of malloc failures */
  SrcList *pList,     /* Append to this SrcList. NULL creates a new SrcList */
  Token *pTable,      /* Table to append */
  Token *pDatabase    /* Database of the table */
){
  struct SrcList_item *pItem;
  assert( pDatabase==0 || pTable!=0 );  /* Cannot have C without B */
  assert( db!=0 );
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(db, sizeof(SrcList) );
    if( pList==0 ) return 0;
    pList->nAlloc = 1;
    pList->nSrc = 1;
    memset(&pList->a[0], 0, sizeof(pList->a[0]));
    pList->a[0].iCursor = -1;
  }else{
    pList = sqlite3SrcListEnlarge(db, pList, 1, pList->nSrc);
  }
  if( db->mallocFailed ){
    sqlite3SrcListDelete(db, pList);
    return 0;
  }
  pItem = &pList->a[pList->nSrc-1];
  if( pDatabase && pDatabase->z==0 ){
    pDatabase = 0;
  }
  if( pDatabase ){
    pItem->zName = sqlite3NameFromToken(db, pDatabase);
    pItem->zDatabase = sqlite3NameFromToken(db, pTable);
  }else{
    pItem->zName = sqlite3NameFromToken(db, pTable);
    pItem->zDatabase = 0;
  }
  return pList;
}